

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

Engine * __thiscall
adios2::core::IO::Open(IO *this,string *name,Mode mode,Comm *comm,char *md,size_t mdsize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  pointer pcVar5;
  _Base_ptr p_Var6;
  Engine *pEVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  string *str;
  bool bVar11;
  int iVar12;
  Mode MVar13;
  iterator iVar14;
  long *plVar15;
  undefined8 *puVar16;
  ulong uVar17;
  const_iterator cVar18;
  iterator iVar19;
  char *pcVar20;
  size_type *psVar21;
  Comm *this_00;
  size_type sVar22;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  pVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_bool>
  pVar24;
  string msg;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Mode local_cc;
  string engineTypeLC;
  shared_ptr<adios2::core::Engine> local_a8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
  *local_90;
  string *local_88;
  Comm local_80;
  Comm local_78;
  Comm local_70;
  char *local_68;
  ScopedTimer __var2535;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_cc = mode;
  local_68 = md;
  if ((Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
       ::__var535 == '\0') &&
     (iVar12 = __cxa_guard_acquire(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                                    ::__var535), iVar12 != 0)) {
    Open::__var535 = (void *)ps_timer_create_("IO::Open");
    __cxa_guard_release(&Open(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,char_const*,unsigned_long)
                         ::__var535);
  }
  __var2535.m_timer = Open::__var535;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_90 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
              *)&this->m_Engines;
  local_88 = name;
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                   *)local_90,name);
  if ((_Rb_tree_header *)iVar14._M_node != &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header) {
    bVar11 = Engine::operator_cast_to_bool(*(Engine **)(iVar14._M_node + 2));
    if (bVar11) {
      engineTypeLC._M_dataplus._M_p = (pointer)&engineTypeLC.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&engineTypeLC,"Core","");
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"IO","");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Open","");
      std::operator+(&local_f0,"Engine ",local_88);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
      psVar21 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_110.field_2._M_allocated_capacity = *psVar21;
        local_110.field_2._8_8_ = plVar15[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar21;
        local_110._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_110._M_string_length = plVar15[1];
      *plVar15 = (long)psVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      helper::Throw<std::invalid_argument>(&engineTypeLC,&msg,&local_130,&local_110,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)engineTypeLC._M_dataplus._M_p != &engineTypeLC.field_2) {
        operator_delete(engineTypeLC._M_dataplus._M_p);
      }
    }
    else {
      pVar23 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
               ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                              *)local_90,local_88);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                      *)local_90,(_Base_ptr)pVar23.first._M_node,(_Base_ptr)pVar23.second._M_node);
    }
  }
  local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar4 = (this->m_EngineType)._M_string_length;
  engineTypeLC._M_dataplus._M_p = (pointer)&engineTypeLC.field_2;
  pcVar5 = (this->m_EngineType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&engineTypeLC,pcVar5,pcVar5 + sVar4);
  sVar9 = engineTypeLC._M_string_length;
  _Var8._M_p = engineTypeLC._M_dataplus._M_p;
  if ((sVar4 != 0) && (engineTypeLC._M_string_length != 0)) {
    sVar22 = 0;
    do {
      iVar12 = tolower((int)_Var8._M_p[sVar22]);
      _Var8._M_p[sVar22] = (char)iVar12;
      sVar22 = sVar22 + 1;
    } while (sVar9 != sVar22);
  }
  iVar12 = std::__cxx11::string::compare((char *)&engineTypeLC);
  str = local_88;
  if ((((iVar12 != 0) &&
       (iVar12 = std::__cxx11::string::compare((char *)&engineTypeLC), iVar12 != 0)) &&
      (iVar12 = std::__cxx11::string::compare((char *)&engineTypeLC), sVar4 != 0)) && (iVar12 != 0))
  goto LAB_00371597;
  paVar1 = &msg.field_2;
  msg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".h5","");
  bVar11 = helper::EndsWith(str,&msg,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != paVar1) {
    operator_delete(msg._M_dataplus._M_p);
  }
  if (bVar11) {
    pcVar20 = "hdf5";
LAB_00371581:
    std::__cxx11::string::_M_replace
              ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,(ulong)pcVar20);
  }
  else {
    msg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".aca","");
    bVar11 = helper::EndsWith(str,&msg,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != paVar1) {
      operator_delete(msg._M_dataplus._M_p);
    }
    if (bVar11) {
      pcVar20 = "campaign";
      goto LAB_00371581;
    }
    if ((local_cc != ReadRandomAccess) && (local_cc != Read)) {
      pcVar20 = "bp5";
      goto LAB_00371581;
    }
    bVar11 = adios2sys::SystemTools::FileIsDirectory(str);
    if (bVar11) {
      helper::BPVersion(str,comm,&this->m_TransportsParameters);
      std::__cxx11::string::_M_replace
                ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,0x73e66a);
      std::__cxx11::string::push_back((char)&engineTypeLC);
    }
    else {
      pcVar5 = (str->_M_dataplus)._M_p;
      msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&msg,pcVar5,pcVar5 + str->_M_string_length);
      std::__cxx11::string::append((char *)&msg);
      bVar11 = adios2sys::SystemTools::FileIsDirectory(&msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != paVar1) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if (bVar11) {
        pcVar20 = "mhs";
        goto LAB_00371581;
      }
      msg._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&msg,".bp","");
      bVar11 = helper::EndsWith(str,&msg,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != paVar1) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if (bVar11) {
        pcVar20 = "bp3";
      }
      else {
        bVar11 = helper::IsHDF5File(str,this,comm,&this->m_TransportsParameters);
        pcVar20 = "bp3";
        if (bVar11) {
          pcVar20 = "hdf5";
        }
      }
      std::__cxx11::string::operator=((string *)&engineTypeLC,pcVar20);
    }
  }
LAB_00371597:
  iVar12 = std::__cxx11::string::compare((char *)&engineTypeLC);
  if (iVar12 == 0) {
    helper::BPVersion(str,comm,&this->m_TransportsParameters);
    std::__cxx11::string::_M_replace
              ((ulong)&engineTypeLC,0,(char *)engineTypeLC._M_string_length,0x73e66a);
    std::__cxx11::string::push_back((char)&engineTypeLC);
  }
  iVar12 = std::__cxx11::string::compare((char *)&engineTypeLC);
  if (iVar12 != 0) goto LAB_00371c84;
  if (local_cc == Sync) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"IO","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Open","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Sync mode is not supported in the inline engine.","");
    helper::Throw<std::runtime_error>(&msg,&local_130,&local_110,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
LAB_003717e8:
      operator_delete(msg._M_dataplus._M_p);
    }
  }
  else if (local_cc == Append) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"IO","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Open","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Append mode is not supported in the inline engine.","");
    helper::Throw<std::runtime_error>(&msg,&local_130,&local_110,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) goto LAB_003717e8;
  }
  uVar17 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (1 < uVar17) {
    std::operator+(&local_f0,"Failed to add engine ",str);
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    paVar1 = &local_110.field_2;
    psVar21 = puVar16 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_110.field_2._M_allocated_capacity = *psVar21;
      local_110.field_2._8_8_ = puVar16[3];
      local_110._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar21;
      local_110._M_dataplus._M_p = (pointer)*puVar16;
    }
    local_110._M_string_length = puVar16[1];
    *puVar16 = psVar21;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_110,(ulong)(this->m_Name)._M_dataplus._M_p);
    paVar2 = &local_130.field_2;
    psVar21 = (size_type *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_130.field_2._M_allocated_capacity = *psVar21;
      local_130.field_2._8_8_ = plVar15[3];
      local_130._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar21;
      local_130._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_130._M_string_length = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_130);
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    psVar21 = (size_type *)(plVar15 + 2);
    if ((size_type *)*plVar15 == psVar21) {
      msg.field_2._M_allocated_capacity = *psVar21;
      msg.field_2._8_8_ = plVar15[3];
    }
    else {
      msg.field_2._M_allocated_capacity = *psVar21;
      msg._M_dataplus._M_p = (pointer)*plVar15;
    }
    msg._M_string_length = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    paVar3 = &local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::append((char *)&msg);
    local_130._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Core","");
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"IO","");
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Open","");
    helper::Throw<std::runtime_error>(&local_130,&local_110,&local_f0,&msg,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
    uVar17 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (uVar17 == 1) {
    p_Var6 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pEVar7 = *(Engine **)(p_Var6 + 2);
    p_Var6 = p_Var6[2]._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var6->_M_parent = *(int *)&p_Var6->_M_parent + 1;
      }
    }
    MVar13 = Engine::OpenMode(pEVar7);
    if (MVar13 == local_cc) {
      std::operator+(&local_f0,"The previously added engine ",&pEVar7->m_Name);
      puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      psVar21 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_110.field_2._M_allocated_capacity = *psVar21;
        local_110.field_2._8_8_ = puVar16[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar21;
        local_110._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_110._M_string_length = puVar16[1];
      *puVar16 = psVar21;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_110,(ulong)(str->_M_dataplus)._M_p);
      paVar1 = &local_130.field_2;
      psVar21 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar21) {
        local_130.field_2._M_allocated_capacity = *psVar21;
        local_130.field_2._8_8_ = puVar16[3];
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar21;
        local_130._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_130._M_string_length = puVar16[1];
      *puVar16 = psVar21;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_130);
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      psVar21 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar21) {
        msg.field_2._M_allocated_capacity = *psVar21;
        msg.field_2._8_8_ = plVar15[3];
      }
      else {
        msg.field_2._M_allocated_capacity = *psVar21;
        msg._M_dataplus._M_p = (pointer)*plVar15;
      }
      msg._M_string_length = plVar15[1];
      *plVar15 = (long)psVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      paVar2 = &local_f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)&msg);
      local_130._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Core","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"IO","");
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Open","");
      helper::Throw<std::runtime_error>(&local_130,&local_110,&local_f0,&msg,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
    }
    if (p_Var6 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6);
    }
  }
LAB_00371c84:
  MVar13 = local_cc;
  if (local_cc == ReadRandomAccess) {
    cVar18 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(anonymous_namespace)::ReadRandomAccess_Supported_abi_cxx11_,&engineTypeLC);
    if (cVar18.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
        ._M_cur == (__node_type *)0x0) {
      MVar13 = ReadRandomAccess;
    }
    else {
      MVar13 = (uint)*(byte *)((long)cVar18.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                                     ._M_cur + 0x28) * 2 + Read;
    }
  }
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::FactoryMutex);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  iVar19 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(anonymous_namespace)::Factory_abi_cxx11_,&engineTypeLC);
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::FactoryMutex);
  if (iVar19.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
      ._M_cur == (__node_type *)0x0) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"IO","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Open","");
    std::operator+(&local_50,"Engine type ",&this->m_EngineType);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar21 = (size_type *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_f0.field_2._M_allocated_capacity = *psVar21;
      local_f0.field_2._8_8_ = plVar15[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar21;
      local_f0._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_f0._M_string_length = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    helper::Throw<std::invalid_argument>(&msg,&local_130,&local_110,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
  }
  else {
    if ((local_68 == (char *)0x0) || (MVar13 != ReadRandomAccess)) {
      if ((MVar13 == ReadRandomAccess) || (MVar13 == Read)) {
        helper::Comm::Comm(&local_78,comm);
        local_130._M_dataplus._M_p._0_4_ = MVar13;
        if (*(long *)((long)iVar19.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                            ._M_cur + 0x38) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)((long)iVar19.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                           ._M_cur + 0x40))
                  (&msg,(long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                              ._M_cur + 0x28,this,str,&local_130,&local_78);
        _Var10._M_pi = local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
        local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)msg._M_dataplus;
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi),
           msg._M_string_length != 0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
        }
        this_00 = &local_78;
      }
      else {
        helper::Comm::Comm(&local_80,comm);
        local_130._M_dataplus._M_p._0_4_ = MVar13;
        if (*(long *)((long)iVar19.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                            ._M_cur + 0x58) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)((long)iVar19.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                           ._M_cur + 0x60))
                  (&msg,(long)iVar19.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                              ._M_cur + 0x48,this,str,&local_130,&local_80);
        _Var10._M_pi = local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
        local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
        local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)msg._M_dataplus;
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length = 0;
        if ((_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi),
           msg._M_string_length != 0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
        }
        this_00 = &local_80;
      }
    }
    else {
      helper::Comm::Comm(&local_70,comm);
      std::
      function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
      ::operator()((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
                    *)&msg,(IO *)((long)iVar19.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO::EngineFactoryEntry>,_true>
                                        ._M_cur + 0x68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (Mode)str,(Comm *)0x4,(char *)&local_70,(unsigned_long)local_68);
      _Var10._M_pi = local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length;
      local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)msg._M_dataplus;
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length = 0;
      if ((_Var10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var10._M_pi),
         msg._M_string_length != 0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg._M_string_length);
      }
      this_00 = &local_70;
    }
    helper::Comm::~Comm(this_00);
  }
  pVar24 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Engine>>>>
           ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<adios2::core::Engine>>
                     (local_90,str,&local_a8);
  if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&msg,"Core","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"IO","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Open","");
    std::operator+(&local_f0,"failed to create Engine ",&this->m_EngineType);
    helper::Throw<std::invalid_argument>(&msg,&local_130,&local_110,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p);
    }
  }
  pEVar7 = *(Engine **)(pVar24.first._M_node._M_node + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)engineTypeLC._M_dataplus._M_p != &engineTypeLC.field_2) {
    operator_delete(engineTypeLC._M_dataplus._M_p);
  }
  if (local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2535);
  return pEVar7;
}

Assistant:

Engine &IO::Open(const std::string &name, const Mode mode, helper::Comm comm, const char *md,
                 const size_t mdsize)
{
    PERFSTUBS_SCOPED_TIMER("IO::Open");
    auto itEngineFound = m_Engines.find(name);
    const bool isEngineFound = (itEngineFound != m_Engines.end());
    bool isEngineActive = false;
    Mode mode_to_use = mode;

    if (isEngineFound)
    {
        if (*itEngineFound->second)
        {
            isEngineActive = true;
        }
    }

    if (isEngineFound)
    {
        if (isEngineActive) // check if active
        {
            helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                                 "Engine " + name + " is opened twice");
        }
    }

    if (isEngineFound)
    {
        if (!isEngineActive)
        {
            m_Engines.erase(name);
        }
    }

    std::shared_ptr<Engine> engine;
    const bool isDefaultEngine = m_EngineType.empty() ? true : false;
    std::string engineTypeLC = m_EngineType;
    if (!isDefaultEngine)
    {
        std::transform(engineTypeLC.begin(), engineTypeLC.end(), engineTypeLC.begin(), ::tolower);
    }

    /* Second step in handling virtual engines */
    /* BPFile for read needs to use BP5, BP4, or BP3 depending on the file's
     * version
     */
    if ((engineTypeLC == "file" || engineTypeLC == "bpfile" || engineTypeLC == "bp" ||
         isDefaultEngine))
    {
        if (helper::EndsWith(name, ".h5", false))
        {
            engineTypeLC = "hdf5";
        }
        else if (helper::EndsWith(name, ".aca", false))
        {
            engineTypeLC = "campaign";
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            if (adios2sys::SystemTools::FileIsDirectory(name))
            {
                char v = helper::BPVersion(name, comm, m_TransportsParameters);
                engineTypeLC = "bp";
                engineTypeLC.push_back(v);
            }
            else if (adios2sys::SystemTools::FileIsDirectory(name + ".tier0"))
            {
                engineTypeLC = "mhs";
            }
            else
            {
                if (helper::EndsWith(name, ".bp", false))
                {
                    engineTypeLC = "bp3";
                }
                else
                {
                    /* We need to figure out the type of file
                     * from the file itself
                     */
                    if (helper::IsHDF5File(name, *this, comm, m_TransportsParameters))
                    {
                        engineTypeLC = "hdf5";
                    }
                    else
                    {
                        engineTypeLC = "bp3";
                    }
                }
            }
        }
        else
        {
            // File default for writing: BP5
            engineTypeLC = "bp5";
        }
    }

    /* Note: Mismatch between BP4/BP5 writer and FileStream reader is not
       handled if writer has not created the directory yet, when FileStream
       falls back to default (BP4) */
    if (engineTypeLC == "filestream")
    {
        char v = helper::BPVersion(name, comm, m_TransportsParameters);
        engineTypeLC = "bp";
        engineTypeLC.push_back(v);
        // std::cout << "Engine " << engineTypeLC << " selected for FileStream"
        //          << std::endl;
    }

    // For the inline engine, there must be exactly 1 reader, and exactly 1
    // writer.
    if (engineTypeLC == "inline")
    {
        if (mode_to_use == Mode::Append)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Append mode is not supported in the inline engine.");
        }

        // See inline.rst:44
        if (mode_to_use == Mode::Sync)
        {
            helper::Throw<std::runtime_error>("Core", "IO", "Open",
                                              "Sync mode is not supported in the inline engine.");
        }

        if (m_Engines.size() >= 2)
        {
            std::string msg = "Failed to add engine " + name + " to IO \'" + m_Name + "\'. ";
            msg += "An inline engine must have exactly one writer, and one "
                   "reader. ";
            msg += "There are already two engines declared, so no more can be "
                   "added.";
            helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
        }
        // Now protect against declaration of two writers, or declaration of
        // two readers:
        if (m_Engines.size() == 1)
        {
            auto engine_ptr = m_Engines.begin()->second;
            if (engine_ptr->OpenMode() == mode_to_use)
            {
                std::string msg = "The previously added engine " + engine_ptr->m_Name +
                                  " is already opened in same mode requested for " + name + ". ";
                msg += "The inline engine requires exactly one writer and one "
                       "reader.";
                helper::Throw<std::runtime_error>("Core", "IO", "Open", msg);
            }
        }
    }

    if (mode_to_use == Mode::ReadRandomAccess)
    {
        // older engines don't know about ReadRandomAccess Mode
        auto it = ReadRandomAccess_Supported.find(engineTypeLC);
        if (it != ReadRandomAccess_Supported.end())
        {
            if (!it->second)
            {
                mode_to_use = Mode::Read;
            }
        }
    }

    auto f = FactoryLookup(engineTypeLC);
    if (f != Factory.end())
    {
        if (md && mode_to_use == Mode::ReadRandomAccess)
        {
            engine =
                f->second.MakeReaderWithMD(*this, name, mode_to_use, std::move(comm), md, mdsize);
        }
        else if ((mode_to_use == Mode::Read) || (mode_to_use == Mode::ReadRandomAccess))
        {
            engine = f->second.MakeReader(*this, name, mode_to_use, std::move(comm));
        }
        else
        {
            engine = f->second.MakeWriter(*this, name, mode_to_use, std::move(comm));
        }
    }
    else
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "Engine type " + m_EngineType + " is not valid");
    }

    auto itEngine = m_Engines.emplace(name, std::move(engine));

    if (!itEngine.second)
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "Open",
                                             "failed to create Engine " + m_EngineType);
    }
    // return a reference
    return *itEngine.first->second.get();
}